

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

bool __thiscall xmrig::Client::parseJob(Client *this,Value *params,int *code)

{
  Job *this_00;
  bool bVar1;
  type tVar2;
  EVP_PKEY_CTX *pEVar3;
  char *pcVar4;
  Type pGVar5;
  long lVar6;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  int __fd;
  uint uVar7;
  EVP_PKEY_CTX *dst;
  Type pGVar8;
  ulong uVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> b;
  uint64_t t_stamp;
  Job job;
  String local_160;
  unsigned_long local_148;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  Job local_130;
  Job *other;
  
  if ((params->data_).f.flags != 3) {
    *code = 2;
    return false;
  }
  Job::Job(&local_130,&this->m_rpcId);
  pEVar3 = (EVP_PKEY_CTX *)
           rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)params,"job_id");
  dst = (EVP_PKEY_CTX *)(*(ulong *)(pEVar3 + 8) & 0xffffffffffff);
  if ((*(ushort *)(pEVar3 + 0xe) >> 0xc & 1) != 0) {
    dst = pEVar3;
  }
  String::copy(&local_130.m_id,dst,src);
  if (local_130.m_id.m_data == (char *)0x0) {
    *code = 3;
  }
  else {
    if ((this->super_BaseClient).m_pool.m_mode == MODE_SELF_SELECT) {
      pcVar4 = Json::getString(params,"extra_nonce",(char *)0x0);
      String::String(&local_160,pcVar4);
      String::copy(&local_130.m_extraNonce,(EVP_PKEY_CTX *)&local_160,src_00);
      if ((uchar *)local_160.m_data != (uchar *)0x0) {
        operator_delete__(local_160.m_data);
      }
      pcVar4 = Json::getString(params,"pool_wallet",(char *)0x0);
      String::String(&local_160,pcVar4);
      String::copy(&local_130.m_poolWallet,(EVP_PKEY_CTX *)&local_160,src_01);
      if ((uchar *)local_160.m_data != (uchar *)0x0) {
        operator_delete__(local_160.m_data);
      }
      if ((local_130.m_extraNonce.m_data == (char *)0x0) ||
         (local_130.m_poolWallet.m_data == (char *)0x0)) {
LAB_001498d5:
        *code = 4;
        goto LAB_001498e5;
      }
    }
    else {
      pGVar5 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)params,"blob");
      pGVar8 = (Type)((ulong)(pGVar5->data_).s.str & 0xffffffffffff);
      if (((pGVar5->data_).f.flags >> 0xc & 1) != 0) {
        pGVar8 = pGVar5;
      }
      bVar1 = Job::setBlob(&local_130,(char *)pGVar8);
      if (!bVar1) goto LAB_001498d5;
    }
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)params,"target");
    pGVar8 = (Type)((ulong)(pGVar5->data_).s.str & 0xffffffffffff);
    if (((pGVar5->data_).f.flags >> 0xc & 1) != 0) {
      pGVar8 = pGVar5;
    }
    bVar1 = Job::setTarget(&local_130,(char *)pGVar8);
    if (bVar1) {
      local_130.m_height = Json::getUint64(params,"height",0);
      String::copy(&(this->super_BaseClient).m_job.m_clientId,(EVP_PKEY_CTX *)&this->m_rpcId,src_02)
      ;
      this_00 = &(this->super_BaseClient).m_job;
      other = &local_130;
      bVar1 = Job::isEqual(this_00,other);
      __fd = (int)other;
      if (!bVar1) {
        this->m_jobs = this->m_jobs + 1;
        Job::move(this_00,&local_130);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_160,
                   (this->super_BaseClient).m_job.m_blob + 2,
                   (this->super_BaseClient).m_job.m_blob +
                   ((this->super_BaseClient).m_job.m_size - 2),(allocator_type *)&local_148);
        local_148 = 0;
        local_138._M_current = (uchar *)local_160.m_data;
        local_140._M_current = (uchar *)local_160.m_size;
        tVar2 = std::enable_if<((std::is_integral<unsigned_long>::value&&std::
                is_unsigned<unsigned_long>::value)&&((0)<=(64)))&&((64)<=std::
                numeric_limits<unsigned_long>::digits),int>::type_tools::read_varint<64,__gnu_cxx::
                __normal_iterator<unsigned_char*,std::vector<unsigned_char,std::
                allocator<unsigned_char>>>_unsigned_long>(&local_138,&local_140,&local_148);
        lVar6 = (long)tVar2;
        uVar7 = (uint)(byte)local_160.m_data[lVar6 + 1] << 8 |
                (uint)(byte)local_160.m_data[lVar6] << 0x10 |
                (uint)(byte)local_160.m_data[lVar6 + 2];
        uVar9 = (ulong)((int)(local_148 % (ulong)(uVar7 + (uVar7 == 0))) + (int)local_130.m_height &
                       0x7fff);
        printf("%lu\n",uVar9 + 0x40000);
        (this->super_BaseClient).m_job.m_extraIters = uVar9;
        if ((uchar *)local_160.m_data != (uchar *)0x0) {
          operator_delete(local_160.m_data);
        }
        bVar1 = true;
        goto LAB_001498e7;
      }
      if (this->m_jobs != 0) {
        if (((this->super_BaseClient).m_quiet == false) &&
           ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
          __fd = 0x18b614;
          Log::print(WARNING,"[%s] duplicate job received, reconnect",
                     (this->super_BaseClient).m_pool.m_url.m_url.m_data);
        }
        close(this,__fd);
      }
    }
    else {
      *code = 5;
    }
  }
LAB_001498e5:
  bVar1 = false;
LAB_001498e7:
  Job::~Job(&local_130);
  return bVar1;
}

Assistant:

bool xmrig::Client::parseJob(const rapidjson::Value &params, int *code)
{
    if (!params.IsObject()) {
        *code = 2;
        return false;
    }

    Job job(m_rpcId);

    if (!job.setId(params["job_id"].GetString())) {
        *code = 3;
        return false;
    }

#   ifdef XMRIG_FEATURE_HTTP
    if (m_pool.mode() == Pool::MODE_SELF_SELECT) {
        job.setExtraNonce(Json::getString(params, "extra_nonce"));
        job.setPoolWallet(Json::getString(params, "pool_wallet"));

        if (job.extraNonce().isNull() || job.poolWallet().isNull()) {
            *code = 4;
            return false;
        }
    }
    else
#   endif
    {
        if (!job.setBlob(params["blob"].GetString())) {
            *code = 4;
            return false;
        }
    }

    if (!job.setTarget(params["target"].GetString())) {
        *code = 5;
        return false;
    }

    job.setHeight(Json::getUint64(params, "height"));
    m_job.setClientId(m_rpcId);

    if (m_job != job)
    {
        m_jobs++;
        m_job = std::move(job);

        const uint8_t* blob = m_job.blob();
        size_t blob_size = m_job.size();

        std::vector<uint8_t> b(blob + 2, blob + (blob_size - 2));
        uint64_t t_stamp = 0;
        int read = tools::read_varint(b.begin(), b.end(), t_stamp);

        uint8_t id_num_bytes[4] = {0};
        id_num_bytes[2] = b[read++];
        id_num_bytes[1] = b[read++];
        id_num_bytes[0] = b[read++];

        uint32_t id_num = *((uint32_t*)id_num_bytes);

        if (id_num < 1)
            id_num = 1;

        uint64_t extra_iters = ((t_stamp % id_num) + job.height()) & 0x7FFF;

        printf("%lu\n", 0x40000 + extra_iters);

        m_job.setExtraIters(extra_iters);
        
        return true;
    }

    if (m_jobs == 0) { // https://github.com/xmrig/xmrig/issues/459
        return false;
    }

    if (!isQuiet()) {
        LOG_WARN("[%s] duplicate job received, reconnect", url());
    }

    close();
    return false;
}